

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SoftHSM.cpp
# Opt level: O3

CK_RV __thiscall
SoftHSM::generateGOST
          (SoftHSM *this,CK_SESSION_HANDLE hSession,CK_ATTRIBUTE_PTR pPublicKeyTemplate,
          CK_ULONG ulPublicKeyAttributeCount,CK_ATTRIBUTE_PTR pPrivateKeyTemplate,
          CK_ULONG ulPrivateKeyAttributeCount,CK_OBJECT_HANDLE_PTR phPublicKey,
          CK_OBJECT_HANDLE_PTR phPrivateKey,CK_BBOOL isPublicKeyOnToken,CK_BBOOL isPublicKeyPrivate,
          CK_BBOOL isPrivateKeyOnToken,CK_BBOOL isPrivateKeyPrivate)

{
  _func_int **pp_Var1;
  char cVar2;
  byte bVar3;
  int iVar4;
  Session *this_00;
  Token *this_01;
  size_t sVar5;
  CryptoFactory *pCVar6;
  undefined4 extraout_var;
  long *plVar7;
  long *plVar8;
  char *pcVar9;
  ulong uVar10;
  ByteString *pBVar11;
  CK_ULONG CVar12;
  CK_ULONG CVar13;
  CK_ATTRIBUTE_PTR p_Var14;
  unsigned_long *puVar15;
  CK_RV CVar16;
  bool bVar17;
  ByteString point;
  CK_KEY_TYPE publicKeyType;
  CK_OBJECT_CLASS publicKeyClass;
  ByteString local_res170;
  ByteString param_c;
  ByteString local_res1c0;
  ByteString local_res1e8;
  CK_KEY_TYPE privateKeyType;
  CK_OBJECT_CLASS privateKeyClass;
  ECParameters p;
  CK_ATTRIBUTE publicKeyAttribs [32];
  long *local_560;
  long *local_558;
  CK_ULONG local_550;
  CK_SESSION_HANDLE local_548;
  ByteString local_540;
  OSAttribute local_518;
  long *local_478;
  CK_ATTRIBUTE_PTR local_470;
  ByteString local_468;
  ByteString local_440;
  ByteString local_418;
  ByteString local_3f0;
  ByteString local_3c8;
  ByteString local_3a0;
  undefined1 local_378 [16];
  ECParameters local_368;
  ByteString local_338;
  undefined8 local_310;
  undefined8 local_308;
  CK_BBOOL *local_300;
  undefined8 local_2f8;
  undefined8 local_2f0;
  ByteString *local_2e8;
  undefined8 local_2e0;
  
  *phPublicKey = 0;
  *phPrivateKey = 0;
  this_00 = (Session *)HandleManager::getSession(this->handleManager,hSession);
  if (this_00 == (Session *)0x0) {
    return 0xb3;
  }
  this_01 = Session::getToken(this_00);
  if (this_01 == (Token *)0x0) {
    return 5;
  }
  ByteString::ByteString(&local_3a0);
  ByteString::ByteString(&local_418);
  local_550 = ulPrivateKeyAttributeCount;
  local_548 = hSession;
  local_470 = pPrivateKeyTemplate;
  ByteString::ByteString(&local_3c8);
  if (ulPublicKeyAttributeCount != 0) {
    puVar15 = &pPublicKeyTemplate->ulValueLen;
    CVar13 = ulPublicKeyAttributeCount;
    do {
      sVar5 = ((_CK_ATTRIBUTE *)(puVar15 + -2))->type;
      if (sVar5 == 0x252) {
        ByteString::ByteString(&local_338,(uchar *)puVar15[-1],*puVar15);
        ByteString::operator=(&local_3c8,&local_338);
LAB_0013f3f6:
        local_338._vptr_ByteString = (_func_int **)&PTR__ByteString_0019d880;
        std::_Vector_base<unsigned_char,_SecureAllocator<unsigned_char>_>::~_Vector_base
                  (&local_338.byteString.
                    super__Vector_base<unsigned_char,_SecureAllocator<unsigned_char>_>);
      }
      else {
        if (sVar5 == 0x251) {
          ByteString::ByteString(&local_338,(uchar *)puVar15[-1],*puVar15);
          ByteString::operator=(&local_418,&local_338);
          goto LAB_0013f3f6;
        }
        if (sVar5 == 0x250) {
          ByteString::ByteString(&local_338,(uchar *)puVar15[-1],*puVar15);
          ByteString::operator=(&local_3a0,&local_338);
          goto LAB_0013f3f6;
        }
      }
      puVar15 = puVar15 + 3;
      CVar13 = CVar13 - 1;
    } while (CVar13 != 0);
  }
  sVar5 = ByteString::size(&local_3a0);
  if ((sVar5 == 0) || (sVar5 = ByteString::size(&local_418), sVar5 == 0)) {
    CVar16 = 0xd0;
    softHSMLog(6,"generateGOST",
               "/workspace/llm4binary/github/license_c_cmakelists/opendnssec[P]SoftHSMv2/src/lib/SoftHSM.cpp"
               ,0x2759,"Missing parameter(s) in pPublicKeyTemplate");
    goto LAB_0013f77f;
  }
  local_368.super_AsymmetricParameters.super_Serialisable._vptr_Serialisable =
       (Serialisable)&PTR_serialise_0019b6c0;
  ByteString::ByteString(&local_368.ec);
  ECParameters::setEC(&local_368,&local_3a0);
  local_560 = (long *)0x0;
  pCVar6 = CryptoFactory::i();
  iVar4 = (*pCVar6->_vptr_CryptoFactory[2])(pCVar6,6);
  plVar7 = (long *)CONCAT44(extraout_var,iVar4);
  CVar16 = 5;
  if (plVar7 != (long *)0x0) {
    cVar2 = (**(code **)(*plVar7 + 0x60))(plVar7,&local_560,&local_368,0);
    if (cVar2 == '\0') {
      softHSMLog(3,"generateGOST",
                 "/workspace/llm4binary/github/license_c_cmakelists/opendnssec[P]SoftHSMv2/src/lib/SoftHSM.cpp"
                 ,0x2767,"Could not generate key pair");
      pCVar6 = CryptoFactory::i();
      (*pCVar6->_vptr_CryptoFactory[3])(pCVar6,plVar7);
    }
    else {
      local_478 = (long *)(**(code **)(*local_560 + 0x18))();
      local_558 = plVar7;
      plVar7 = (long *)(**(code **)(*local_560 + 0x28))();
      local_440._vptr_ByteString = (_func_int **)0x2;
      local_468._vptr_ByteString = (_func_int **)0x30;
      memset(&local_338,0,0x300);
      local_338.byteString.super__Vector_base<unsigned_char,_SecureAllocator<unsigned_char>_>.
      _M_impl.super__Vector_impl_data._M_start = (pointer)0x8;
      local_338.byteString.super__Vector_base<unsigned_char,_SecureAllocator<unsigned_char>_>.
      _M_impl.super__Vector_impl_data._M_finish = (pointer)0x1;
      local_338.byteString.super__Vector_base<unsigned_char,_SecureAllocator<unsigned_char>_>.
      _M_impl.super__Vector_impl_data._M_end_of_storage = &isPublicKeyOnToken;
      local_310 = 1;
      local_308 = 2;
      local_300 = &isPublicKeyPrivate;
      local_2f8 = 1;
      local_2f0 = 0x100;
      local_2e0 = 8;
      local_338.byteString.super__Vector_base<unsigned_char,_SecureAllocator<unsigned_char>_>.
      _M_impl.super__Tp_alloc_type._vptr_SecureAllocator = (_func_int **)&local_440;
      local_2e8 = &local_468;
      if (ulPublicKeyAttributeCount - 1 < 0x1c) {
        uVar10 = 1;
        CVar12 = 4;
        do {
          CVar13 = CVar12;
          if ((2 < pPublicKeyTemplate->type) && (pPublicKeyTemplate->type != 0x100)) {
            CVar13 = CVar12 + 1;
            (&local_338.byteString.
              super__Vector_base<unsigned_char,_SecureAllocator<unsigned_char>_>._M_impl.
              super__Vector_impl_data)[CVar12]._M_start = (pointer)pPublicKeyTemplate->ulValueLen;
            pp_Var1 = (_func_int **)pPublicKeyTemplate->pValue;
            (&local_338._vptr_ByteString)[CVar12 * 3] = (_func_int **)pPublicKeyTemplate->type;
            (&local_338.byteString.
              super__Vector_base<unsigned_char,_SecureAllocator<unsigned_char>_>._M_impl.
              super__Tp_alloc_type)[CVar12 * 3]._vptr_SecureAllocator = pp_Var1;
          }
          if (0x1c < ulPublicKeyAttributeCount) break;
          pPublicKeyTemplate = pPublicKeyTemplate + 1;
          bVar17 = uVar10 < ulPublicKeyAttributeCount;
          uVar10 = uVar10 + 1;
          CVar12 = CVar13;
        } while (bVar17);
LAB_0013f682:
        CVar16 = CreateObject(this,local_548,(CK_ATTRIBUTE_PTR)&local_338,CVar13,phPublicKey,4);
        if (CVar16 == 0) {
          plVar8 = (long *)HandleManager::getObject(this->handleManager,*phPublicKey);
          CVar16 = 6;
          if (((plVar8 != (long *)0x0) &&
              (cVar2 = (**(code **)(*plVar8 + 0x50))(plVar8), cVar2 != '\0')) &&
             (cVar2 = (**(code **)(*plVar8 + 0x58))(plVar8,1), cVar2 != '\0')) {
            OSAttribute::OSAttribute(&local_518,true);
            cVar2 = (**(code **)(*plVar8 + 0x40))(plVar8,0x163,&local_518);
            OSAttribute::~OSAttribute(&local_518);
            if (cVar2 == '\0') {
              cVar2 = '\0';
            }
            else {
              OSAttribute::OSAttribute(&local_518,0x1040);
              cVar2 = (**(code **)(*plVar8 + 0x40))(plVar8,0x166,&local_518);
              OSAttribute::~OSAttribute(&local_518);
            }
            ByteString::ByteString(&local_540);
            if (isPublicKeyPrivate == '\0') {
              pBVar11 = (ByteString *)(**(code **)(*local_478 + 0x40))();
              ByteString::operator=(&local_540,pBVar11);
            }
            else {
              pcVar9 = (char *)(**(code **)(*local_478 + 0x40))();
              Token::encrypt(this_01,pcVar9,(int)&local_540);
            }
            if (cVar2 != '\0') {
              OSAttribute::OSAttribute(&local_518,&local_540);
              cVar2 = (**(code **)(*plVar8 + 0x40))(plVar8,0x11,&local_518);
              OSAttribute::~OSAttribute(&local_518);
              if (cVar2 != '\0') {
                cVar2 = (**(code **)(*plVar8 + 0x60))(plVar8);
                local_540._vptr_ByteString = (_func_int **)&PTR__ByteString_0019d880;
                std::_Vector_base<unsigned_char,_SecureAllocator<unsigned_char>_>::~_Vector_base
                          (&local_540.byteString.
                            super__Vector_base<unsigned_char,_SecureAllocator<unsigned_char>_>);
                if (cVar2 != '\0') {
                  local_378._8_8_ = (_func_int **)0x3;
                  local_378._0_8_ = (_func_int **)0x30;
                  memset(&local_338,0,0x300);
                  local_338.byteString.
                  super__Vector_base<unsigned_char,_SecureAllocator<unsigned_char>_>._M_impl.
                  super__Vector_impl_data._M_start = (pointer)0x8;
                  local_338.byteString.
                  super__Vector_base<unsigned_char,_SecureAllocator<unsigned_char>_>._M_impl.
                  super__Vector_impl_data._M_finish = (pointer)0x1;
                  local_338.byteString.
                  super__Vector_base<unsigned_char,_SecureAllocator<unsigned_char>_>._M_impl.
                  super__Vector_impl_data._M_end_of_storage = &isPrivateKeyOnToken;
                  local_310 = 1;
                  local_308 = 2;
                  local_300 = &isPrivateKeyPrivate;
                  local_2f8 = 1;
                  local_2f0 = 0x100;
                  local_2e0 = 8;
                  local_338.byteString.
                  super__Vector_base<unsigned_char,_SecureAllocator<unsigned_char>_>._M_impl.
                  super__Tp_alloc_type._vptr_SecureAllocator = (_func_int **)(local_378 + 8);
                  local_2e8 = (ByteString *)local_378;
                  if (local_550 - 1 < 0x1c) {
                    uVar10 = 1;
                    CVar12 = 4;
                    p_Var14 = local_470;
                    do {
                      CVar13 = CVar12;
                      if ((2 < p_Var14->type) && (p_Var14->type != 0x100)) {
                        CVar13 = CVar12 + 1;
                        (&local_338.byteString.
                          super__Vector_base<unsigned_char,_SecureAllocator<unsigned_char>_>._M_impl
                          .super__Vector_impl_data)[CVar12]._M_start = (pointer)p_Var14->ulValueLen;
                        pp_Var1 = (_func_int **)p_Var14->pValue;
                        (&local_338._vptr_ByteString)[CVar12 * 3] = (_func_int **)p_Var14->type;
                        (&local_338.byteString.
                          super__Vector_base<unsigned_char,_SecureAllocator<unsigned_char>_>._M_impl
                          .super__Tp_alloc_type)[CVar12 * 3]._vptr_SecureAllocator = pp_Var1;
                      }
                      if (0x1c < local_550) break;
                      p_Var14 = p_Var14 + 1;
                      bVar17 = uVar10 < local_550;
                      uVar10 = uVar10 + 1;
                      CVar12 = CVar13;
                    } while (bVar17);
                  }
                  else {
                    CVar16 = 0xd1;
                    CVar13 = 4;
                    if (0x1c < local_550) goto LAB_0013f6ae;
                  }
                  CVar16 = CreateObject(this,local_548,(CK_ATTRIBUTE_PTR)&local_338,CVar13,
                                        phPrivateKey,4);
                  if (CVar16 == 0) {
                    plVar8 = (long *)HandleManager::getObject(this->handleManager,*phPrivateKey);
                    CVar16 = 6;
                    if (((plVar8 != (long *)0x0) &&
                        (cVar2 = (**(code **)(*plVar8 + 0x50))(plVar8), cVar2 != '\0')) &&
                       (cVar2 = (**(code **)(*plVar8 + 0x58))(plVar8,1), cVar2 != '\0')) {
                      OSAttribute::OSAttribute(&local_518,true);
                      cVar2 = (**(code **)(*plVar8 + 0x40))(plVar8,0x163,&local_518);
                      OSAttribute::~OSAttribute(&local_518);
                      if (cVar2 == '\0') {
                        cVar2 = '\0';
                      }
                      else {
                        OSAttribute::OSAttribute(&local_518,0x1040);
                        cVar2 = (**(code **)(*plVar8 + 0x40))(plVar8,0x166,&local_518);
                        OSAttribute::~OSAttribute(&local_518);
                      }
                      bVar17 = (bool)(**(code **)(*plVar8 + 0x20))(plVar8,0x103,0);
                      if (cVar2 == '\0') {
                        cVar2 = '\0';
                      }
                      else {
                        OSAttribute::OSAttribute(&local_518,bVar17);
                        cVar2 = (**(code **)(*plVar8 + 0x40))(plVar8,0x165,&local_518);
                        OSAttribute::~OSAttribute(&local_518);
                      }
                      bVar3 = (**(code **)(*plVar8 + 0x20))(plVar8,0x162,0);
                      if (cVar2 == '\0') {
                        cVar2 = '\0';
                      }
                      else {
                        OSAttribute::OSAttribute(&local_518,(bool)(bVar3 ^ 1));
                        cVar2 = (**(code **)(*plVar8 + 0x40))(plVar8,0x164,&local_518);
                        OSAttribute::~OSAttribute(&local_518);
                      }
                      ByteString::ByteString(&local_540);
                      ByteString::ByteString(&local_440);
                      ByteString::ByteString(&local_468);
                      ByteString::ByteString(&local_3f0);
                      if (isPrivateKeyPrivate == '\0') {
                        pBVar11 = (ByteString *)(**(code **)(*plVar7 + 0x50))(plVar7);
                        ByteString::operator=(&local_540,pBVar11);
                        pBVar11 = (ByteString *)(**(code **)(*plVar7 + 0x58))();
                        ByteString::operator=(&local_440,pBVar11);
                        ByteString::operator=(&local_468,&local_418);
                        ByteString::operator=(&local_3f0,&local_3c8);
                      }
                      else {
                        pcVar9 = (char *)(**(code **)(*plVar7 + 0x50))(plVar7);
                        Token::encrypt(this_01,pcVar9,(int)&local_540);
                        pcVar9 = (char *)(**(code **)(*plVar7 + 0x58))();
                        Token::encrypt(this_01,pcVar9,(int)&local_440);
                        Token::encrypt(this_01,(char *)&local_418,(int)&local_468);
                        Token::encrypt(this_01,(char *)&local_3c8,(int)&local_3f0);
                      }
                      if (cVar2 == '\0') {
LAB_0013fdf7:
                        (**(code **)(*plVar8 + 0x68))(plVar8);
                        CVar16 = 6;
                      }
                      else {
                        OSAttribute::OSAttribute(&local_518,&local_540);
                        cVar2 = (**(code **)(*plVar8 + 0x40))(plVar8,0x11,&local_518);
                        OSAttribute::~OSAttribute(&local_518);
                        if (cVar2 == '\0') goto LAB_0013fdf7;
                        OSAttribute::OSAttribute(&local_518,&local_440);
                        cVar2 = (**(code **)(*plVar8 + 0x40))(plVar8,0x250,&local_518);
                        OSAttribute::~OSAttribute(&local_518);
                        if (cVar2 == '\0') goto LAB_0013fdf7;
                        OSAttribute::OSAttribute(&local_518,&local_468);
                        cVar2 = (**(code **)(*plVar8 + 0x40))(plVar8,0x251,&local_518);
                        OSAttribute::~OSAttribute(&local_518);
                        if (cVar2 == '\0') goto LAB_0013fdf7;
                        OSAttribute::OSAttribute(&local_518,&local_3f0);
                        cVar2 = (**(code **)(*plVar8 + 0x40))(plVar8,0x252,&local_518);
                        OSAttribute::~OSAttribute(&local_518);
                        if (cVar2 == '\0') goto LAB_0013fdf7;
                        cVar2 = (**(code **)(*plVar8 + 0x60))(plVar8);
                        CVar16 = 6;
                        if (cVar2 != '\0') {
                          CVar16 = 0;
                        }
                      }
                      local_3f0._vptr_ByteString = (_func_int **)&PTR__ByteString_0019d880;
                      std::_Vector_base<unsigned_char,_SecureAllocator<unsigned_char>_>::
                      ~_Vector_base(&local_3f0.byteString.
                                     super__Vector_base<unsigned_char,_SecureAllocator<unsigned_char>_>
                                   );
                      local_468._vptr_ByteString = (_func_int **)&PTR__ByteString_0019d880;
                      std::_Vector_base<unsigned_char,_SecureAllocator<unsigned_char>_>::
                      ~_Vector_base(&local_468.byteString.
                                     super__Vector_base<unsigned_char,_SecureAllocator<unsigned_char>_>
                                   );
                      local_440._vptr_ByteString = (_func_int **)&PTR__ByteString_0019d880;
                      std::_Vector_base<unsigned_char,_SecureAllocator<unsigned_char>_>::
                      ~_Vector_base(&local_440.byteString.
                                     super__Vector_base<unsigned_char,_SecureAllocator<unsigned_char>_>
                                   );
                      local_540._vptr_ByteString = (_func_int **)&PTR__ByteString_0019d880;
                      std::_Vector_base<unsigned_char,_SecureAllocator<unsigned_char>_>::
                      ~_Vector_base(&local_540.byteString.
                                     super__Vector_base<unsigned_char,_SecureAllocator<unsigned_char>_>
                                   );
                    }
                  }
                }
                goto LAB_0013f6ae;
              }
            }
            (**(code **)(*plVar8 + 0x68))(plVar8);
            local_540._vptr_ByteString = (_func_int **)&PTR__ByteString_0019d880;
            std::_Vector_base<unsigned_char,_SecureAllocator<unsigned_char>_>::~_Vector_base
                      (&local_540.byteString.
                        super__Vector_base<unsigned_char,_SecureAllocator<unsigned_char>_>);
          }
        }
      }
      else {
        CVar16 = 0xd1;
        CVar13 = 4;
        if (ulPublicKeyAttributeCount < 0x1d) goto LAB_0013f682;
      }
LAB_0013f6ae:
      (**(code **)(*local_558 + 0xc0))(local_558,local_560);
      pCVar6 = CryptoFactory::i();
      (*pCVar6->_vptr_CryptoFactory[3])(pCVar6,local_558);
      if (CVar16 == 0) {
        CVar16 = 0;
      }
      else {
        if (*phPrivateKey != 0) {
          plVar7 = (long *)HandleManager::getObject(this->handleManager,*phPrivateKey);
          HandleManager::destroyObject(this->handleManager,*phPrivateKey);
          if (plVar7 != (long *)0x0) {
            (**(code **)(*plVar7 + 0x70))(plVar7);
          }
          *phPrivateKey = 0;
        }
        if (*phPublicKey != 0) {
          plVar7 = (long *)HandleManager::getObject(this->handleManager,*phPublicKey);
          HandleManager::destroyObject(this->handleManager,*phPublicKey);
          if (plVar7 != (long *)0x0) {
            (**(code **)(*plVar7 + 0x70))(plVar7);
          }
          *phPublicKey = 0;
        }
      }
    }
  }
  local_368.super_AsymmetricParameters.super_Serialisable._vptr_Serialisable =
       (Serialisable)&PTR_serialise_0019b6c0;
  local_368.ec._vptr_ByteString = (_func_int **)&PTR__ByteString_0019d880;
  std::_Vector_base<unsigned_char,_SecureAllocator<unsigned_char>_>::~_Vector_base
            (&local_368.ec.byteString.
              super__Vector_base<unsigned_char,_SecureAllocator<unsigned_char>_>);
LAB_0013f77f:
  local_3c8._vptr_ByteString = (_func_int **)&PTR__ByteString_0019d880;
  std::_Vector_base<unsigned_char,_SecureAllocator<unsigned_char>_>::~_Vector_base
            (&local_3c8.byteString.
              super__Vector_base<unsigned_char,_SecureAllocator<unsigned_char>_>);
  local_418._vptr_ByteString = (_func_int **)&PTR__ByteString_0019d880;
  std::_Vector_base<unsigned_char,_SecureAllocator<unsigned_char>_>::~_Vector_base
            (&local_418.byteString.
              super__Vector_base<unsigned_char,_SecureAllocator<unsigned_char>_>);
  local_3a0._vptr_ByteString = (_func_int **)&PTR__ByteString_0019d880;
  std::_Vector_base<unsigned_char,_SecureAllocator<unsigned_char>_>::~_Vector_base
            (&local_3a0.byteString.
              super__Vector_base<unsigned_char,_SecureAllocator<unsigned_char>_>);
  return CVar16;
}

Assistant:

CK_RV SoftHSM::generateGOST
(CK_SESSION_HANDLE hSession,
	CK_ATTRIBUTE_PTR pPublicKeyTemplate,
	CK_ULONG ulPublicKeyAttributeCount,
	CK_ATTRIBUTE_PTR pPrivateKeyTemplate,
	CK_ULONG ulPrivateKeyAttributeCount,
	CK_OBJECT_HANDLE_PTR phPublicKey,
	CK_OBJECT_HANDLE_PTR phPrivateKey,
	CK_BBOOL isPublicKeyOnToken,
	CK_BBOOL isPublicKeyPrivate,
	CK_BBOOL isPrivateKeyOnToken,
	CK_BBOOL isPrivateKeyPrivate)
{
	*phPublicKey = CK_INVALID_HANDLE;
	*phPrivateKey = CK_INVALID_HANDLE;

	// Get the session
	Session* session = (Session*)handleManager->getSession(hSession);
	if (session == NULL)
		return CKR_SESSION_HANDLE_INVALID;

	// Get the token
	Token* token = session->getToken();
	if (token == NULL)
		return CKR_GENERAL_ERROR;

	// Extract desired key information
	ByteString param_3410;
	ByteString param_3411;
	ByteString param_28147;
	for (CK_ULONG i = 0; i < ulPublicKeyAttributeCount; i++)
	{
		switch (pPublicKeyTemplate[i].type)
		{
			case CKA_GOSTR3410_PARAMS:
				param_3410 = ByteString((unsigned char*)pPublicKeyTemplate[i].pValue, pPublicKeyTemplate[i].ulValueLen);
				break;
			case CKA_GOSTR3411_PARAMS:
				param_3411 = ByteString((unsigned char*)pPublicKeyTemplate[i].pValue, pPublicKeyTemplate[i].ulValueLen);
				break;
			case CKA_GOST28147_PARAMS:
				param_28147 = ByteString((unsigned char*)pPublicKeyTemplate[i].pValue, pPublicKeyTemplate[i].ulValueLen);
				break;
			default:
				break;
		}
	}

	// The parameters must be specified to be able to generate a key pair.
	if (param_3410.size() == 0 || param_3411.size() == 0) {
		INFO_MSG("Missing parameter(s) in pPublicKeyTemplate");
		return CKR_TEMPLATE_INCOMPLETE;
	}

	// Set the parameters
	ECParameters p;
	p.setEC(param_3410);

	// Generate key pair
	AsymmetricKeyPair* kp = NULL;
	AsymmetricAlgorithm* gost = CryptoFactory::i()->getAsymmetricAlgorithm(AsymAlgo::GOST);
	if (gost == NULL) return CKR_GENERAL_ERROR;
	if (!gost->generateKeyPair(&kp, &p))
	{
		ERROR_MSG("Could not generate key pair");
		CryptoFactory::i()->recycleAsymmetricAlgorithm(gost);
		return CKR_GENERAL_ERROR;
	}

	GOSTPublicKey* pub = (GOSTPublicKey*) kp->getPublicKey();
	GOSTPrivateKey* priv = (GOSTPrivateKey*) kp->getPrivateKey();

	CK_RV rv = CKR_OK;

	// Create a public key using C_CreateObject
	if (rv == CKR_OK)
	{
		const CK_ULONG maxAttribs = 32;
		CK_OBJECT_CLASS publicKeyClass = CKO_PUBLIC_KEY;
		CK_KEY_TYPE publicKeyType = CKK_GOSTR3410;
		CK_ATTRIBUTE publicKeyAttribs[maxAttribs] = {
			{ CKA_CLASS, &publicKeyClass, sizeof(publicKeyClass) },
			{ CKA_TOKEN, &isPublicKeyOnToken, sizeof(isPublicKeyOnToken) },
			{ CKA_PRIVATE, &isPublicKeyPrivate, sizeof(isPublicKeyPrivate) },
			{ CKA_KEY_TYPE, &publicKeyType, sizeof(publicKeyType) },
		};
		CK_ULONG publicKeyAttribsCount = 4;

		// Add the additional
		if (ulPublicKeyAttributeCount > (maxAttribs - publicKeyAttribsCount))
			rv = CKR_TEMPLATE_INCONSISTENT;
		for (CK_ULONG i=0; i < ulPublicKeyAttributeCount && rv == CKR_OK; ++i)
		{
			switch (pPublicKeyTemplate[i].type)
			{
				case CKA_CLASS:
				case CKA_TOKEN:
				case CKA_PRIVATE:
				case CKA_KEY_TYPE:
					continue;
				default:
					publicKeyAttribs[publicKeyAttribsCount++] = pPublicKeyTemplate[i];
			}
		}

		if (rv == CKR_OK)
			rv = this->CreateObject(hSession,publicKeyAttribs,publicKeyAttribsCount,phPublicKey,OBJECT_OP_GENERATE);

		// Store the attributes that are being supplied by the key generation to the object
		if (rv == CKR_OK)
		{
			OSObject* osobject = (OSObject*)handleManager->getObject(*phPublicKey);
			if (osobject == NULL_PTR || !osobject->isValid()) {
				rv = CKR_FUNCTION_FAILED;
			} else if (osobject->startTransaction()) {
				bool bOK = true;

				// Common Key Attributes
				bOK = bOK && osobject->setAttribute(CKA_LOCAL,true);
				CK_ULONG ulKeyGenMechanism = (CK_ULONG)CKM_EC_KEY_PAIR_GEN;
				bOK = bOK && osobject->setAttribute(CKA_KEY_GEN_MECHANISM,ulKeyGenMechanism);

				// EC Public Key Attributes
				ByteString point;
				if (isPublicKeyPrivate)
				{
					token->encrypt(pub->getQ(), point);
				}
				else
				{
					point = pub->getQ();
				}
				bOK = bOK && osobject->setAttribute(CKA_VALUE, point);

				if (bOK)
					bOK = osobject->commitTransaction();
				else
					osobject->abortTransaction();

				if (!bOK)
					rv = CKR_FUNCTION_FAILED;
			} else
				rv = CKR_FUNCTION_FAILED;
		}
	}

	// Create a private key using C_CreateObject
	if (rv == CKR_OK)
	{
		const CK_ULONG maxAttribs = 32;
		CK_OBJECT_CLASS privateKeyClass = CKO_PRIVATE_KEY;
		CK_KEY_TYPE privateKeyType = CKK_GOSTR3410;
		CK_ATTRIBUTE privateKeyAttribs[maxAttribs] = {
			{ CKA_CLASS, &privateKeyClass, sizeof(privateKeyClass) },
			{ CKA_TOKEN, &isPrivateKeyOnToken, sizeof(isPrivateKeyOnToken) },
			{ CKA_PRIVATE, &isPrivateKeyPrivate, sizeof(isPrivateKeyPrivate) },
			{ CKA_KEY_TYPE, &privateKeyType, sizeof(privateKeyType) },
		};
		CK_ULONG privateKeyAttribsCount = 4;
		if (ulPrivateKeyAttributeCount > (maxAttribs - privateKeyAttribsCount))
			rv = CKR_TEMPLATE_INCONSISTENT;
		for (CK_ULONG i=0; i < ulPrivateKeyAttributeCount && rv == CKR_OK; ++i)
		{
			switch (pPrivateKeyTemplate[i].type)
			{
				case CKA_CLASS:
				case CKA_TOKEN:
				case CKA_PRIVATE:
				case CKA_KEY_TYPE:
					continue;
				default:
					privateKeyAttribs[privateKeyAttribsCount++] = pPrivateKeyTemplate[i];
			}
		}

		if (rv == CKR_OK)
			rv = this->CreateObject(hSession,privateKeyAttribs,privateKeyAttribsCount,phPrivateKey,OBJECT_OP_GENERATE);

		// Store the attributes that are being supplied by the key generation to the object
		if (rv == CKR_OK)
		{
			OSObject* osobject = (OSObject*)handleManager->getObject(*phPrivateKey);
			if (osobject == NULL_PTR || !osobject->isValid()) {
				rv = CKR_FUNCTION_FAILED;
			} else if (osobject->startTransaction()) {
				bool bOK = true;

				// Common Key Attributes
				bOK = bOK && osobject->setAttribute(CKA_LOCAL,true);
				CK_ULONG ulKeyGenMechanism = (CK_ULONG)CKM_EC_KEY_PAIR_GEN;
				bOK = bOK && osobject->setAttribute(CKA_KEY_GEN_MECHANISM,ulKeyGenMechanism);

				// Common Private Key Attributes
				bool bAlwaysSensitive = osobject->getBooleanValue(CKA_SENSITIVE, false);
				bOK = bOK && osobject->setAttribute(CKA_ALWAYS_SENSITIVE,bAlwaysSensitive);
				bool bNeverExtractable = osobject->getBooleanValue(CKA_EXTRACTABLE, false) == false;
				bOK = bOK && osobject->setAttribute(CKA_NEVER_EXTRACTABLE, bNeverExtractable);

				// GOST Private Key Attributes
				ByteString value;
				ByteString param_a;
				ByteString param_b;
				ByteString param_c;
				if (isPrivateKeyPrivate)
				{
					token->encrypt(priv->getD(), value);
					token->encrypt(priv->getEC(), param_a);
					token->encrypt(param_3411, param_b);
					token->encrypt(param_28147, param_c);
				}
				else
				{
					value = priv->getD();
					param_a = priv->getEC();
					param_b = param_3411;
					param_c = param_28147;
				}
				bOK = bOK && osobject->setAttribute(CKA_VALUE, value);
				bOK = bOK && osobject->setAttribute(CKA_GOSTR3410_PARAMS, param_a);
				bOK = bOK && osobject->setAttribute(CKA_GOSTR3411_PARAMS, param_b);
				bOK = bOK && osobject->setAttribute(CKA_GOST28147_PARAMS, param_c);

				if (bOK)
					bOK = osobject->commitTransaction();
				else
					osobject->abortTransaction();

				if (!bOK)
					rv = CKR_FUNCTION_FAILED;
			} else
				  rv = CKR_FUNCTION_FAILED;
		}
	}

	// Clean up
	gost->recycleKeyPair(kp);
	CryptoFactory::i()->recycleAsymmetricAlgorithm(gost);

	// Remove keys that may have been created already when the function fails.
	if (rv != CKR_OK)
	{
		if (*phPrivateKey != CK_INVALID_HANDLE)
		{
			OSObject* ospriv = (OSObject*)handleManager->getObject(*phPrivateKey);
			handleManager->destroyObject(*phPrivateKey);
			if (ospriv) ospriv->destroyObject();
			*phPrivateKey = CK_INVALID_HANDLE;
		}

		if (*phPublicKey != CK_INVALID_HANDLE)
		{
			OSObject* ospub = (OSObject*)handleManager->getObject(*phPublicKey);
			handleManager->destroyObject(*phPublicKey);
			if (ospub) ospub->destroyObject();
			*phPublicKey = CK_INVALID_HANDLE;
		}
	}

	return rv;
}